

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isSpecialMethodName(SyntaxKind kind)

{
  return (bool)((byte)(0x6c00000 >> ((byte)kind & 0x1f)) & kind < AscendingRangeSelect);
}

Assistant:

bool SyntaxFacts::isSpecialMethodName(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ArrayUniqueMethod:
        case SyntaxKind::ArrayAndMethod:
        case SyntaxKind::ArrayOrMethod:
        case SyntaxKind::ArrayXorMethod:
            return true;
        default:
            return false;
        }
    }